

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool AttrsHaveSameName(AttVal *av1,AttVal *av2)

{
  int iVar1;
  bool local_31;
  TidyAttrId local_30;
  TidyAttrId local_2c;
  TidyAttrId id2;
  TidyAttrId id1;
  AttVal *av2_local;
  AttVal *av1_local;
  
  if ((av1 == (AttVal *)0x0) || (av1->dict == (Attribute *)0x0)) {
    local_2c = TidyAttr_UNKNOWN;
  }
  else {
    local_2c = av1->dict->id;
  }
  if ((av2 == (AttVal *)0x0) || (av2->dict == (Attribute *)0x0)) {
    local_30 = TidyAttr_UNKNOWN;
  }
  else {
    local_30 = av2->dict->id;
  }
  if ((local_2c == TidyAttr_UNKNOWN) || (local_30 == TidyAttr_UNKNOWN)) {
    if ((local_2c == TidyAttr_UNKNOWN) && (local_30 == TidyAttr_UNKNOWN)) {
      if ((av1->attribute == (tmbstr)0x0) || (av2->attribute == (tmbstr)0x0)) {
        av1_local._4_4_ = no;
      }
      else {
        iVar1 = prvTidytmbstrcmp(av1->attribute,av2->attribute);
        av1_local._4_4_ = (Bool)(iVar1 == 0);
      }
    }
    else {
      av1_local._4_4_ = no;
    }
  }
  else {
    local_31 = false;
    if ((((av1 != (AttVal *)0x0) && (local_31 = false, av2 != (AttVal *)0x0)) &&
        (local_31 = false, av1->dict != (Attribute *)0x0)) &&
       (((local_31 = false, av2->dict != (Attribute *)0x0 &&
         (local_31 = false, av1->dict->id != TidyAttr_UNKNOWN)) &&
        (local_31 = false, av2->dict->id != TidyAttr_UNKNOWN)))) {
      local_31 = av1->dict->id == av2->dict->id;
    }
    av1_local._4_4_ = (Bool)local_31;
  }
  return av1_local._4_4_;
}

Assistant:

static Bool AttrsHaveSameName( AttVal* av1, AttVal* av2)
{
    TidyAttrId id1, id2;

    id1 = AttrId(av1);
    id2 = AttrId(av2);
    if (id1 != TidyAttr_UNKNOWN && id2 != TidyAttr_UNKNOWN)
        return AttrsHaveSameId(av1, av2);
    if (id1 != TidyAttr_UNKNOWN || id2 != TidyAttr_UNKNOWN)
        return no;
    if (av1->attribute && av2->attribute)
        return TY_(tmbstrcmp)(av1->attribute, av2->attribute) == 0;
     return no;
}